

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

void Aig_ManPartSetNodePolarity(Aig_Man_t *p,Aig_Man_t *pPart,Vec_Int_t *vPio2Id)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  int local_34;
  int i;
  Aig_Obj_t *pObjInit;
  Aig_Obj_t *pObj;
  Vec_Int_t *vPio2Id_local;
  Aig_Man_t *pPart_local;
  Aig_Man_t *p_local;
  
  pAVar6 = Aig_ManConst1(pPart);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | 8;
  for (local_34 = 0; iVar3 = Vec_PtrSize(pPart->vCis), local_34 < iVar3; local_34 = local_34 + 1) {
    pvVar7 = Vec_PtrEntry(pPart->vCis,local_34);
    iVar3 = Vec_IntEntry(vPio2Id,local_34);
    pAVar6 = Aig_ManObj(p,iVar3);
    *(ulong *)((long)pvVar7 + 0x18) =
         *(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7 |
         (ulong)((uint)(*(ulong *)&pAVar6->field_0x18 >> 3) & 1) << 3;
  }
  for (local_34 = 0; iVar3 = Vec_PtrSize(pPart->vObjs), local_34 < iVar3; local_34 = local_34 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pPart->vObjs,local_34);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      pAVar8 = Aig_ObjFanin0(pAVar6);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar6);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      uVar1 = *(ulong *)&pAVar8->field_0x18;
      uVar4 = Aig_ObjFaninC1(pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
           ((ulong)(((uint)(uVar2 >> 3) & 1 ^ uVar5) & ((uint)(uVar1 >> 3) & 1 ^ uVar4)) & 1) << 3;
    }
  }
  local_34 = 0;
  while( true ) {
    iVar3 = Vec_PtrSize(pPart->vCos);
    if (iVar3 <= local_34) {
      return;
    }
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pPart->vCos,local_34);
    iVar3 = Aig_ManCiNum(pPart);
    iVar3 = Vec_IntEntry(vPio2Id,iVar3 + local_34);
    pAVar8 = Aig_ManObj(p,iVar3);
    pAVar9 = Aig_ObjFanin0(pAVar6);
    uVar2 = *(ulong *)&pAVar9->field_0x18;
    uVar5 = Aig_ObjFaninC0(pAVar6);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
         ((ulong)((uint)(uVar2 >> 3) & 1 ^ uVar5) & 1) << 3;
    if (((uint)(*(ulong *)&pAVar6->field_0x18 >> 3) & 1) !=
        ((uint)(*(ulong *)&pAVar8->field_0x18 >> 3) & 1)) break;
    local_34 = local_34 + 1;
  }
  __assert_fail("pObj->fPhase == pObjInit->fPhase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                ,0x14f,"void Aig_ManPartSetNodePolarity(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Aig_ManPartSetNodePolarity( Aig_Man_t * p, Aig_Man_t * pPart, Vec_Int_t * vPio2Id )
{
    Aig_Obj_t * pObj, * pObjInit;
    int i;
    Aig_ManConst1(pPart)->fPhase = 1;
    Aig_ManForEachCi( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, i) );
        pObj->fPhase = pObjInit->fPhase;
    }
    Aig_ManForEachNode( pPart, pObj, i )
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj)) & (Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, Aig_ManCiNum(pPart) + i) );
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj));
        assert( pObj->fPhase == pObjInit->fPhase );
    }
}